

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndDisabledOverrideReenable(void)

{
  ImGuiContext *pIVar1;
  int *piVar2;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  GImGui->DisabledStackSize = GImGui->DisabledStackSize + -1;
  ImVector<int>::pop_back(&pIVar1->ItemFlagsStack);
  piVar2 = ImVector<int>::back(&pIVar1->ItemFlagsStack);
  pIVar1->CurrentItemFlags = *piVar2;
  (pIVar1->Style).Alpha = pIVar1->DisabledAlphaBackup * (pIVar1->Style).DisabledAlpha;
  return;
}

Assistant:

void ImGui::EndDisabledOverrideReenable()
{
    ImGuiContext& g = *GImGui;
    g.DisabledStackSize--;
    IM_ASSERT(g.DisabledStackSize > 0);
    g.ItemFlagsStack.pop_back();
    g.CurrentItemFlags = g.ItemFlagsStack.back();
    g.Style.Alpha = g.DisabledAlphaBackup * g.Style.DisabledAlpha;
}